

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_BOOL qpdf_oh_is_string(qpdf_data qpdf,qpdf_oh oh)

{
  int iVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = return_false;
  local_10 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_18 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1006:33)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1006:33)>
             ::_M_manager;
  iVar1 = do_with_oh<int>(qpdf,oh,(function<int_()> *)local_28,
                          (function<int_(QPDFObjectHandle_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_is_string(qpdf_data qpdf, qpdf_oh oh)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_is_string");
    return do_with_oh<QPDF_BOOL>(
        qpdf, oh, return_false, [](QPDFObjectHandle& o) { return o.isString(); });
}